

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test8::getGeneralBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test8 *this,_test_case *test_case)

{
  bool bVar1;
  ostream *poVar2;
  reference p_Var3;
  _variable_type type;
  _variable_type type_00;
  uint local_224;
  const_iterator cStack_220;
  uint n_component;
  uint local_214;
  undefined1 local_210 [4];
  uint argument_n_components;
  string argument_variable_type_string;
  const_iterator cStack_1e8;
  _variable_type argument_variable_type;
  __normal_iterator<const_gl4cts::Utils::_variable_type_*,_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>
  local_1e0;
  _argument_list_const_iterator argument_list_iterator;
  undefined1 local_1c8 [8];
  string variable_type_string;
  stringstream result_sstream;
  ostream local_198;
  _test_case *local_20;
  _test_case *test_case_local;
  GPUShaderFP64Test8 *this_local;
  
  local_20 = test_case;
  test_case_local = (_test_case *)this;
  this_local = (GPUShaderFP64Test8 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(variable_type_string.field_2._M_local_buf + 8));
  Utils::getVariableTypeString_abi_cxx11_((string *)local_1c8,(Utils *)(ulong)local_20->type,type);
  poVar2 = std::operator<<(&local_198,(string *)local_1c8);
  poVar2 = std::operator<<(poVar2," src = ");
  poVar2 = std::operator<<(poVar2,(string *)local_1c8);
  std::operator<<(poVar2,"(");
  local_1e0._M_current =
       (_variable_type *)
       std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
       begin(&local_20->argument_list);
  while( true ) {
    cStack_1e8 = std::
                 vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                 ::end(&local_20->argument_list);
    bVar1 = __gnu_cxx::operator!=(&local_1e0,&stack0xfffffffffffffe18);
    if (!bVar1) break;
    p_Var3 = __gnu_cxx::
             __normal_iterator<const_gl4cts::Utils::_variable_type_*,_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>
             ::operator*(&local_1e0);
    argument_variable_type_string.field_2._12_4_ = *p_Var3;
    Utils::getVariableTypeString_abi_cxx11_
              ((string *)local_210,
               (Utils *)(ulong)(uint)argument_variable_type_string.field_2._12_4_,type_00);
    local_214 = Utils::getNumberOfComponentsForVariableType
                          (argument_variable_type_string.field_2._12_4_);
    cStack_220 = std::
                 vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                 ::begin(&local_20->argument_list);
    bVar1 = __gnu_cxx::operator!=(&local_1e0,&stack0xfffffffffffffde0);
    if (bVar1) {
      std::operator<<(&local_198,", ");
    }
    poVar2 = std::operator<<(&local_198,(string *)local_210);
    std::operator<<(poVar2,"(");
    for (local_224 = 0; local_224 < local_214; local_224 = local_224 + 1) {
      std::ostream::operator<<(&local_198,(double)(local_224 + 1));
      if (local_224 != local_214 - 1) {
        std::operator<<(&local_198,", ");
      }
    }
    std::operator<<(&local_198,")");
    std::__cxx11::string::~string((string *)local_210);
    __gnu_cxx::
    __normal_iterator<const_gl4cts::Utils::_variable_type_*,_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>
    ::operator++(&local_1e0,0);
  }
  std::operator<<(&local_198,");\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(variable_type_string.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test8::getGeneralBody(const _test_case& test_case)
{
	std::stringstream result_sstream;

	/* Form the body */
	std::string variable_type_string = Utils::getVariableTypeString(test_case.type);

	result_sstream << variable_type_string << " src = " << variable_type_string << "(";

	for (_argument_list_const_iterator argument_list_iterator = test_case.argument_list.begin();
		 argument_list_iterator != test_case.argument_list.end(); argument_list_iterator++)
	{
		const Utils::_variable_type argument_variable_type = *argument_list_iterator;
		std::string		   argument_variable_type_string   = Utils::getVariableTypeString(argument_variable_type);
		const unsigned int argument_n_components = Utils::getNumberOfComponentsForVariableType(argument_variable_type);

		if (argument_list_iterator != test_case.argument_list.begin())
		{
			result_sstream << ", ";
		}

		result_sstream << argument_variable_type_string << "(";

		for (unsigned int n_component = 0; n_component < argument_n_components; ++n_component)
		{
			result_sstream << (double)(n_component + 1);

			if (n_component != (argument_n_components - 1))
			{
				result_sstream << ", ";
			}
		} /* for (all argument components) */

		result_sstream << ")";
	} /* for (all arguments) */

	result_sstream << ");\n";

	return result_sstream.str();
}